

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

FPolyNode * NewPolyNode(void)

{
  FPolyNode *pFVar1;
  
  if (FreePolyNodes == (FPolyNode *)0x0) {
    pFVar1 = (FPolyNode *)operator_new(0x40);
    (pFVar1->segs).Array = (FPolySeg *)0x0;
    (pFVar1->segs).Most = 0;
    (pFVar1->segs).Count = 0;
  }
  else {
    pFVar1 = FreePolyNodes;
    FreePolyNodes = FreePolyNodes->pnext;
  }
  pFVar1->state = 0x539;
  pFVar1->poly = (FPolyObj *)0x0;
  pFVar1->pnext = (FPolyNode *)0x0;
  pFVar1->pprev = (FPolyNode *)0x0;
  pFVar1->subsector = (subsector_t *)0x0;
  pFVar1->snext = (FPolyNode *)0x0;
  return pFVar1;
}

Assistant:

static FPolyNode *NewPolyNode()
{
	FPolyNode *node;

	if (FreePolyNodes != NULL)
	{
		node = FreePolyNodes;
		FreePolyNodes = node->pnext;
	}
	else
	{
		node = new FPolyNode;
	}
	node->state = 1337;
	node->poly = NULL;
	node->pnext = NULL;
	node->pprev = NULL;
	node->subsector = NULL;
	node->snext = NULL;
	return node;
}